

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pfVar2;
  char cVar3;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string outputFileName;
  FastText fasttext;
  Args a;
  ofstream ofs;
  string local_3c0;
  string local_3a0;
  FastText local_380;
  Args local_308;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  ::fasttext::Args::Args(&local_308);
  ::fasttext::Args::parseArgs(&local_308,args);
  ::fasttext::FastText::FastText(&local_380);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a0,local_308.output._M_dataplus._M_p,
             local_308.output._M_dataplus._M_p + local_308.output._M_string_length);
  std::__cxx11::string::append((char *)&local_3a0);
  std::ofstream::ofstream(&local_220,(string *)&local_3a0,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ofstream::close();
    ::fasttext::FastText::train(&local_380,&local_308);
    ::fasttext::FastText::saveModel(&local_380,&local_3a0);
    paVar1 = &local_3c0.field_2;
    local_3c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_308.output._M_dataplus._M_p,
               local_308.output._M_dataplus._M_p + local_308.output._M_string_length);
    std::__cxx11::string::append((char *)&local_3c0);
    ::fasttext::FastText::saveVectors(&local_380,&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if (local_308.saveOutput == true) {
      local_3c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_308.output._M_dataplus._M_p,
                 local_308.output._M_dataplus._M_p + local_308.output._M_string_length);
      std::__cxx11::string::append((char *)&local_3c0);
      ::fasttext::FastText::saveOutput(&local_380,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p);
      }
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if ((tuple<fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>)
        local_380.wordVectors_._M_t.
        super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>.
        _M_t.
        super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
        .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl !=
        (_Head_base<0UL,_fasttext::DenseMatrix_*,_false>)0x0) {
      pfVar2 = (((vector<float,_std::allocator<float>_> *)
                ((long)local_380.wordVectors_._M_t.
                       super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                       .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl + 0x18))
               ->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      if (pfVar2 != (pointer)0x0) {
        operator_delete(pfVar2);
      }
      operator_delete((void *)local_380.wordVectors_._M_t.
                              super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                              .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl);
    }
    local_380.wordVectors_._M_t.
    super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t.
    super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
    super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl =
         (__uniq_ptr_data<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>,_true,_true>
          )(__uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>)0x0;
    if (local_380.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_380.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_380.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_380.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_380.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_380.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_380.dict_.super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_380.dict_.
                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_380.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_380.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.pretrainedVectors._M_dataplus._M_p != &local_308.pretrainedVectors.field_2) {
      operator_delete(local_308.pretrainedVectors._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.label._M_dataplus._M_p != &local_308.label.field_2) {
      operator_delete(local_308.label._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.output._M_dataplus._M_p != &local_308.output.field_2) {
      operator_delete(local_308.output._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.input._M_dataplus._M_p != &local_308.input.field_2) {
      operator_delete(local_308.input._M_dataplus._M_p);
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_3c0,&local_3a0," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)&local_3c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  FastText fasttext;
  std::string outputFileName(a.output + ".bin");
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  fasttext.train(a);
  fasttext.saveModel(outputFileName);
  fasttext.saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext.saveOutput(a.output + ".output");
  }
}